

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O0

void __thiscall dg::LLVMDependenceGraph::~LLVMDependenceGraph(LLVMDependenceGraph *this)

{
  bool bVar1;
  reference ppLVar2;
  long lVar3;
  reference ppVar4;
  DGParameters<dg::LLVMNode> *pDVar5;
  BBlock<dg::LLVMNode> *this_00;
  DependenceGraph<dg::LLVMNode> *in_RDI;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *it;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  LLVMDependenceGraph *subgraph;
  iterator __end3;
  iterator __begin3;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *__range3;
  LLVMNode *node;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I;
  iterator __end1;
  iterator __begin1;
  LLVMDependenceGraph *__range1;
  DependenceGraph<dg::LLVMNode> *in_stack_ffffffffffffff58;
  LLVMNode *in_stack_ffffffffffffff60;
  DependenceGraphBase *in_stack_ffffffffffffff68;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60;
  element_type *local_58;
  LLVMDependenceGraph *local_50;
  _Self local_48;
  _Self local_40;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *local_38;
  LLVMNode *in_stack_ffffffffffffffd0;
  LLVMNode *pLVar6;
  _Self local_20;
  _Self local_18 [3];
  
  (in_RDI->super_DependenceGraphBase)._vptr_DependenceGraphBase =
       (_func_int **)&PTR__LLVMDependenceGraph_001b99d0;
  local_18[0]._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::begin(in_stack_ffffffffffffff58);
  local_20._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::end(in_stack_ffffffffffffff58);
  while (bVar1 = std::operator!=(local_18,&local_20), bVar1) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                        0x17c1d7);
    pLVar6 = ppVar4->second;
    in_stack_ffffffffffffffd0 = pLVar6;
    if (pLVar6 != (LLVMNode *)0x0) {
      local_38 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSubgraphs
                           (&pLVar6->
                             super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
      local_40._M_node =
           (_Base_ptr)
           std::
           set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
           ::begin((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                    *)in_stack_ffffffffffffff58);
      local_48._M_node =
           (_Base_ptr)
           std::
           set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
           ::end((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                  *)in_stack_ffffffffffffff58);
      while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
        ppLVar2 = std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator*
                            ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)0x17c248);
        local_50 = *ppLVar2;
        DependenceGraphBase::unref
                  (in_stack_ffffffffffffff68,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
        std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator++
                  ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)in_stack_ffffffffffffff60);
      }
      in_stack_ffffffffffffff80 =
           (BBlock<dg::LLVMNode> *)
           Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getParameters
                     (&pLVar6->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
      if (in_stack_ffffffffffffff80 != (BBlock<dg::LLVMNode> *)0x0) {
        DGParameters<dg::LLVMNode>::~DGParameters((DGParameters<dg::LLVMNode> *)pLVar6);
        operator_delete(in_stack_ffffffffffffff80,0x88);
      }
      in_stack_ffffffffffffffd0 = pLVar6;
      if (pLVar6 != (LLVMNode *)0x0) {
        LLVMNode::~LLVMNode(in_stack_ffffffffffffff60);
        operator_delete(pLVar6,0x1f0);
      }
    }
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
               in_stack_ffffffffffffff60);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->global_nodes);
  if ((bVar1) &&
     (lVar3 = std::
              __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ::use_count((__shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           *)0x17c316), lVar3 == 1)) {
    local_58 = std::
               __shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_ffffffffffffff60);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::begin((map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
                  *)in_stack_ffffffffffffff58);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::end((map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
                *)in_stack_ffffffffffffff58);
    while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                         ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                          0x17c373);
      pLVar6 = ppVar4->second;
      if (pLVar6 != (LLVMNode *)0x0) {
        LLVMNode::~LLVMNode(in_stack_ffffffffffffff60);
        operator_delete(pLVar6,0x1f0);
      }
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                 in_stack_ffffffffffffff60);
    }
  }
  pDVar5 = DependenceGraph<dg::LLVMNode>::getParameters(in_RDI);
  if (pDVar5 != (DGParameters<dg::LLVMNode> *)0x0) {
    DGParameters<dg::LLVMNode>::~DGParameters
              ((DGParameters<dg::LLVMNode> *)in_stack_ffffffffffffffd0);
    operator_delete(pDVar5,0x88);
  }
  this_00 = DependenceGraph<dg::LLVMNode>::getPostDominatorTreeRoot(in_RDI);
  if (this_00 != (BBlock<dg::LLVMNode> *)0x0) {
    BBlock<dg::LLVMNode>::~BBlock(in_stack_ffffffffffffff80);
    operator_delete(this_00,0x208);
  }
  std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::~set
            ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             0x17c422);
  std::unique_ptr<dg::BBlock<dg::LLVMNode>,_std::default_delete<dg::BBlock<dg::LLVMNode>_>_>::
  ~unique_ptr((unique_ptr<dg::BBlock<dg::LLVMNode>,_std::default_delete<dg::BBlock<dg::LLVMNode>_>_>
               *)this_00);
  DependenceGraph<dg::LLVMNode>::~DependenceGraph
            ((DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

LLVMDependenceGraph::~LLVMDependenceGraph() {
    // delete nodes
    for (auto &I : *this) {
        LLVMNode *node = I.second;

        if (node) {
            for (LLVMDependenceGraph *subgraph : node->getSubgraphs()) {
                // graphs are referenced, once the refcount is 0
                // the graph will be deleted
                // Because of recursive calls, graph can be its
                // own subgraph. In that case we're in the destructor
                // already, so do not delete it
                subgraph->unref(subgraph != this);
            }

            // delete parameters (on null it is no op)
            delete node->getParameters();

#ifdef DEBUG_ENABLED
            if (!node->getBBlock() && !llvm::isa<llvm::Function>(*I.first))
                llvmutils::printerr("Had no BB assigned", I.first);
#endif

            delete node;
        } else {
#ifdef DEBUG_ENABLED
            llvmutils::printerr("Had no node assigned", I.first);
#endif //
        }
    }

    // delete global nodes if this is the last graph holding them
    if (global_nodes && global_nodes.use_count() == 1) {
        for (auto &it : *global_nodes)
            delete it.second;
    }

    // delete formal parameters
    delete getParameters();

    // delete post-dominator tree root
    delete getPostDominatorTreeRoot();
}